

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O1

void dlep_router_apply_interface_settings(dlep_router_if *interf)

{
  list_entity *plVar1;
  avl_tree *paVar2;
  list_entity *plVar3;
  
  oonf_packet_apply_managed(&(interf->interf).udp,&(interf->interf).udp_config);
  _cleanup_interface(interf);
  if ((interf->connect_to_addr)._type == '\0') {
    oonf_timer_stop(&interf->_connect_to_watchdog);
  }
  else {
    _connect_to_setup(interf);
  }
  paVar2 = dlep_extension_get_tree();
  plVar3 = (paVar2->list_head).next;
  while( true ) {
    plVar1 = plVar3->prev;
    paVar2 = dlep_extension_get_tree();
    if (plVar1 == (paVar2->list_head).prev) break;
    if (plVar3[-3].prev != (list_entity *)0x0) {
      (*(code *)plVar3[-3].prev)(interf);
    }
    plVar3 = plVar3->next;
  }
  return;
}

Assistant:

void
dlep_router_apply_interface_settings(struct dlep_router_if *interf) {
  struct dlep_extension *ext;

  oonf_packet_apply_managed(&interf->interf.udp, &interf->interf.udp_config);

  _cleanup_interface(interf);

  if (!netaddr_is_unspec(&interf->connect_to_addr)) {
    _connect_to_setup(interf);
  }
  else {
    oonf_timer_stop(&interf->_connect_to_watchdog);
  }

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (ext->cb_session_apply_router) {
      ext->cb_session_apply_router(&interf->interf.session);
    }
  }
}